

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generators.cpp
# Opt level: O0

Vector3d * opengv::generateRandomDirectionTranslation(double parallax)

{
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RDI;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> PVar1;
  Matrix3d rotation;
  Vector3d *translation;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_01;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff20;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_78 [120];
  
  this_00 = in_RDI;
  generateRandomRotation();
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x2c988b);
  this_01 = local_78;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<(this_01,(Scalar *)this_00);
  this = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                   (in_stack_ffffffffffffff20,(Scalar *)this_01);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(this,(Scalar *)this_01);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x2c98fc);
  PVar1 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,in_RDI);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)in_RDI);
  Eigen::operator*((double *)PVar1.m_rhs,(StorageBaseType *)PVar1.m_lhs);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_RDI);
  return (Vector3d *)
         (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *)in_RDI;
}

Assistant:

Eigen::Vector3d
opengv::generateRandomDirectionTranslation( double parallax )
{
  Matrix3d rotation = generateRandomRotation();
  Vector3d translation;
  translation << 1.0, 0.0, 0.0;
  translation = rotation * translation;
  translation = parallax * translation;
  return translation;
}